

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8DifferentPoliciesTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section8DifferentPoliciesTest8
          (Section8DifferentPoliciesTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section8DifferentPoliciesTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section8DifferentPoliciesTest8(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8DifferentPoliciesTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "PoliciesP12CACert", "PoliciesP12subCAP1Cert",
                               "PoliciesP12subsubCAP1P2Cert",
                               "DifferentPoliciesTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "PoliciesP12CACRL",
                              "PoliciesP12subCAP1CRL",
                              "PoliciesP12subsubCAP1P2CRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.8";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}